

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O3

_Bool monster_can_move(monster *mon,loc_conflict grid)

{
  _Bool _Var1;
  monster *pmVar2;
  monster_race *pmVar3;
  monster_race *pmVar4;
  
  pmVar2 = square_monster(cave,(loc)grid);
  _Var1 = true;
  if (pmVar2 != (monster *)0x0) {
    _Var1 = flag_has_dbg(mon->race->flags,0xc,0x3c,"mon->race->flags","RF_MOVE_BODY");
    if (_Var1) {
      pmVar3 = mon->original_race;
      if (pmVar3 == (monster_race *)0x0) {
        pmVar3 = mon->race;
      }
      pmVar4 = pmVar2->original_race;
      if (pmVar4 == (monster_race *)0x0) {
        pmVar4 = pmVar2->race;
      }
      if ((uint)pmVar4->mexp < (uint)pmVar3->mexp) {
        return true;
      }
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool monster_can_move(struct monster *mon, struct loc grid)
{
	struct monster *mon1 = square_monster(cave, grid);

	/* No monster */
	if (!mon1) return true;

	if (rf_has(mon->race->flags, RF_MOVE_BODY) &&
		compare_monsters(mon, mon1) > 0) {
		return true;
	}

	return false;
}